

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_mix_pcm_frames_f32
                    (float *pDst,float *pSrc,ma_uint64 frameCount,ma_uint32 channels,float volume)

{
  ma_result mVar1;
  long lVar2;
  long lVar3;
  
  mVar1 = MA_INVALID_ARGS;
  if (channels != 0 && (pSrc != (float *)0x0 && pDst != (float *)0x0)) {
    mVar1 = MA_SUCCESS;
    if ((volume != 0.0) || (NAN(volume))) {
      lVar2 = channels * frameCount;
      if ((volume != 1.0) || (NAN(volume))) {
        if (lVar2 != 0) {
          mVar1 = MA_SUCCESS;
          lVar3 = 0;
          do {
            pDst[lVar3] = pSrc[lVar3] * volume + pDst[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar2 - lVar3 != 0);
        }
      }
      else if (lVar2 != 0) {
        mVar1 = MA_SUCCESS;
        lVar3 = 0;
        do {
          pDst[lVar3] = pSrc[lVar3] + pDst[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar2 - lVar3 != 0);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_mix_pcm_frames_f32(float* pDst, const float* pSrc, ma_uint64 frameCount, ma_uint32 channels, float volume)
{
    ma_uint64 iSample;
    ma_uint64 sampleCount;

    if (pDst == NULL || pSrc == NULL || channels == 0) {
        return MA_INVALID_ARGS;
    }

    if (volume == 0) {
        return MA_SUCCESS;  /* No changes if the volume is 0. */
    }

    sampleCount = frameCount * channels;

    if (volume == 1) {
        for (iSample = 0; iSample < sampleCount; iSample += 1) {
            pDst[iSample] += pSrc[iSample];
        }
    } else {
        for (iSample = 0; iSample < sampleCount; iSample += 1) {
            pDst[iSample] += ma_apply_volume_unclipped_f32(pSrc[iSample], volume);
        }
    }

    return MA_SUCCESS;
}